

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

int create_render_pass(Init *init,RenderData *data)

{
  VkResult VVar1;
  int iVar2;
  VkAttachmentReference color_attachment_ref;
  VkSubpassDependency dependency;
  VkAttachmentDescription color_attachment;
  VkRenderPassCreateInfo render_pass_info;
  VkAttachmentReference local_f0;
  VkSubpassDependency local_e8;
  VkAttachmentDescription local_c8;
  VkRenderPassCreateInfo local_98;
  VkSubpassDescription local_58;
  
  local_98.pAttachments = &local_c8;
  local_c8._0_8_ = (ulong)(init->swapchain).image_format << 0x20;
  local_c8.samples = VK_SAMPLE_COUNT_1_BIT;
  local_c8.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_c8.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_c8.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  local_c8.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_c8.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_c8.finalLayout = VK_IMAGE_LAYOUT_PRESENT_SRC_KHR;
  local_58.pColorAttachments = &local_f0;
  local_f0.attachment = 0;
  local_f0.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_98.pSubpasses = &local_58;
  local_58.pInputAttachments = (VkAttachmentReference *)0x0;
  local_58.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_58.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
  local_58.preserveAttachmentCount = 0;
  local_58._60_4_ = 0;
  local_58.flags = 0;
  local_58.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_58.inputAttachmentCount = 0;
  local_58._12_4_ = 0;
  local_58.pPreserveAttachments = (uint32_t *)0x0;
  local_58.colorAttachmentCount = 1;
  local_58._28_4_ = 0;
  local_98.pDependencies = &local_e8;
  local_e8.dependencyFlags = 0;
  local_e8.srcSubpass = 0xffffffff;
  local_e8.dstSubpass = 0;
  local_e8.srcStageMask = 0x400;
  local_e8.srcAccessMask = 0;
  local_e8.dstAccessMask = 0x180;
  local_e8.dstStageMask = 0x400;
  local_98.pNext = (void *)0x0;
  local_98.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.flags = 0;
  local_98.attachmentCount = 1;
  local_98.subpassCount = 1;
  local_98._36_4_ = 0;
  local_98.dependencyCount = 1;
  local_98._52_4_ = 0;
  iVar2 = 0;
  VVar1 = (*(init->disp).fp_vkCreateRenderPass)
                    ((init->disp).device,&local_98,(VkAllocationCallbacks *)0x0,&data->render_pass);
  if (VVar1 != VK_SUCCESS) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to create render pass\n",0x1d);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int create_render_pass(Init& init, RenderData& data) {
    VkAttachmentDescription color_attachment = {};
    color_attachment.format = init.swapchain.image_format;
    color_attachment.samples = VK_SAMPLE_COUNT_1_BIT;
    color_attachment.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
    color_attachment.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    color_attachment.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
    color_attachment.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
    color_attachment.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    color_attachment.finalLayout = VK_IMAGE_LAYOUT_PRESENT_SRC_KHR;

    VkAttachmentReference color_attachment_ref = {};
    color_attachment_ref.attachment = 0;
    color_attachment_ref.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;

    VkSubpassDescription subpass = {};
    subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
    subpass.colorAttachmentCount = 1;
    subpass.pColorAttachments = &color_attachment_ref;

    VkSubpassDependency dependency = {};
    dependency.srcSubpass = VK_SUBPASS_EXTERNAL;
    dependency.dstSubpass = 0;
    dependency.srcStageMask = VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
    dependency.srcAccessMask = 0;
    dependency.dstStageMask = VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
    dependency.dstAccessMask = VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;

    VkRenderPassCreateInfo render_pass_info = {};
    render_pass_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    render_pass_info.attachmentCount = 1;
    render_pass_info.pAttachments = &color_attachment;
    render_pass_info.subpassCount = 1;
    render_pass_info.pSubpasses = &subpass;
    render_pass_info.dependencyCount = 1;
    render_pass_info.pDependencies = &dependency;

    if (init.disp.createRenderPass(&render_pass_info, nullptr, &data.render_pass) != VK_SUCCESS) {
        std::cout << "failed to create render pass\n";
        return -1; // failed to create render pass!
    }
    return 0;
}